

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

OutputInfo * __thiscall cmTarget::GetOutputInfo(cmTarget *this,string *config)

{
  bool bVar1;
  iterator iVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>,_bool>
  pVar3;
  allocator local_121;
  string config_upper;
  string msg;
  OutputInfo info;
  
  if (this->IsImportedTarget == false) {
    if (this->TargetTypeValue < OBJECT_LIBRARY) {
      config_upper._M_dataplus._M_p = (pointer)&config_upper.field_2;
      config_upper._M_string_length = 0;
      config_upper.field_2._M_local_buf[0] = '\0';
      if (config->_M_string_length != 0) {
        cmsys::SystemTools::UpperCase(&msg,config);
        std::__cxx11::string::operator=((string *)&config_upper,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
      }
      iVar2 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>_>_>
              ::find(&(((this->Internal).Pointer)->OutputInfoMap)._M_t,&config_upper);
      if ((_Rb_tree_header *)iVar2._M_node ==
          &(((this->Internal).Pointer)->OutputInfoMap)._M_t._M_impl.super__Rb_tree_header) {
        info.OutDir._M_dataplus._M_p = (pointer)&info.OutDir.field_2;
        info.OutDir._M_string_length = 0;
        info.OutDir.field_2._M_local_buf[0] = '\0';
        info.ImpDir._M_dataplus._M_p = (pointer)&info.ImpDir.field_2;
        info.ImpDir._M_string_length = 0;
        info.ImpDir.field_2._M_local_buf[0] = '\0';
        info.PdbDir._M_dataplus._M_p = (pointer)&info.PdbDir.field_2;
        info.PdbDir._M_string_length = 0;
        info.PdbDir.field_2._M_local_buf[0] = '\0';
        ComputeOutputDir(this,config,false,&info.OutDir);
        ComputeOutputDir(this,config,true,&info.ImpDir);
        std::__cxx11::string::string((string *)&msg,"PDB",&local_121);
        bVar1 = ComputePDBOutputDir(this,&msg,config,&info.PdbDir);
        std::__cxx11::string::~string((string *)&msg);
        if (!bVar1) {
          std::__cxx11::string::_M_assign((string *)&info.PdbDir);
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmTarget::OutputInfo_&,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
                    *)&msg,&config_upper,&info);
        pVar3 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>&>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmTarget::OutputInfo>>>
                            *)&((this->Internal).Pointer)->OutputInfoMap,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
                            *)&msg);
        iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::OutputInfo>
                 *)&msg);
        OutputInfo::~OutputInfo(&info);
      }
      std::__cxx11::string::~string((string *)&config_upper);
      return (OutputInfo *)(iVar2._M_node + 2);
    }
    std::__cxx11::string::string
              ((string *)&msg,"cmTarget::GetOutputInfo called for ",(allocator *)&info);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::append((char *)&msg);
    GetTargetTypeName(this->TargetTypeValue);
    std::__cxx11::string::append((char *)&msg);
    cmMakefile::IssueMessage(this->Makefile,INTERNAL_ERROR,&msg);
    std::__cxx11::string::~string((string *)&msg);
  }
  return (OutputInfo *)0x0;
}

Assistant:

cmTarget::OutputInfo const* cmTarget::GetOutputInfo(
    const std::string& config) const
{
  // There is no output information for imported targets.
  if(this->IsImported())
    {
    return 0;
    }

  // Only libraries and executables have well-defined output files.
  if(!this->HaveWellDefinedOutputFiles())
    {
    std::string msg = "cmTarget::GetOutputInfo called for ";
    msg += this->GetName();
    msg += " which has type ";
    msg += cmTarget::GetTargetTypeName(this->GetType());
    this->GetMakefile()->IssueMessage(cmake::INTERNAL_ERROR, msg);
    return 0;
    }

  // Lookup/compute/cache the output information for this configuration.
  std::string config_upper;
  if(!config.empty())
    {
    config_upper = cmSystemTools::UpperCase(config);
    }
  typedef cmTargetInternals::OutputInfoMapType OutputInfoMapType;
  OutputInfoMapType::const_iterator i =
    this->Internal->OutputInfoMap.find(config_upper);
  if(i == this->Internal->OutputInfoMap.end())
    {
    OutputInfo info;
    this->ComputeOutputDir(config, false, info.OutDir);
    this->ComputeOutputDir(config, true, info.ImpDir);
    if(!this->ComputePDBOutputDir("PDB", config, info.PdbDir))
      {
      info.PdbDir = info.OutDir;
      }
    OutputInfoMapType::value_type entry(config_upper, info);
    i = this->Internal->OutputInfoMap.insert(entry).first;
    }
  return &i->second;
}